

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O0

void cuddUpdateInteractionMatrix(DdManager *table,int xindex,int yindex)

{
  int iVar1;
  int local_1c;
  int i;
  int yindex_local;
  int xindex_local;
  DdManager *table_local;
  
  for (local_1c = 0; local_1c < yindex; local_1c = local_1c + 1) {
    if ((local_1c != xindex) && (iVar1 = cuddTestInteract(table,local_1c,yindex), iVar1 != 0)) {
      if (local_1c < xindex) {
        cuddSetInteract(table,local_1c,xindex);
      }
      else {
        cuddSetInteract(table,xindex,local_1c);
      }
    }
  }
  for (local_1c = yindex + 1; local_1c < table->size; local_1c = local_1c + 1) {
    if ((local_1c != xindex) && (iVar1 = cuddTestInteract(table,yindex,local_1c), iVar1 != 0)) {
      if (local_1c < xindex) {
        cuddSetInteract(table,local_1c,xindex);
      }
      else {
        cuddSetInteract(table,xindex,local_1c);
      }
    }
  }
  return;
}

Assistant:

void
cuddUpdateInteractionMatrix(
  DdManager * table,
  int  xindex,
  int  yindex)
{
    int i;
    for (i = 0; i < yindex; i++) {
        if (i != xindex && cuddTestInteract(table,i,yindex)) {
            if (i < xindex) {
                cuddSetInteract(table,i,xindex);
            } else {
                cuddSetInteract(table,xindex,i);
            }
        }
    }
    for (i = yindex+1; i < table->size; i++) {
        if (i != xindex && cuddTestInteract(table,yindex,i)) {
            if (i < xindex) {
                cuddSetInteract(table,i,xindex);
            } else {
                cuddSetInteract(table,xindex,i);
            }
        }
    }

}